

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-properties.c
# Opt level: O3

activation * lookup_activation(char *act_name)

{
  int iVar1;
  activation *paVar2;
  
  paVar2 = activations + 1;
  do {
    iVar1 = strcmp(paVar2->name,act_name);
    if (iVar1 == 0) {
      return paVar2;
    }
    paVar2 = paVar2->next;
  } while (paVar2 != (activation *)0x0);
  return (activation *)0x0;
}

Assistant:

struct activation *lookup_activation(const char *act_name)
{
	struct activation *act = &activations[1];
	while (act) {
		if (streq(act->name, act_name))
			break;
		act = act->next;
	}
	return act;
}